

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O2

duckdb_state
duckdb_bind_decimal(duckdb_prepared_statement prepared_statement,idx_t param_idx,duckdb_decimal val)

{
  duckdb_state dVar1;
  uint8_t in_R9B;
  hugeint_t value;
  Value VStack_58;
  
  if (val.width < 0x13) {
    duckdb::Value::DECIMAL(&VStack_58,val.value.lower,val.width,val.scale);
    dVar1 = duckdb_bind_value(prepared_statement,param_idx,(duckdb_value)&VStack_58);
  }
  else {
    value.upper._0_1_ = val.width;
    value.lower = val.value.upper;
    value.upper._1_7_ = 0;
    duckdb::Value::DECIMAL(&VStack_58,(Value *)val.value.lower,value,val.scale,in_R9B);
    dVar1 = duckdb_bind_value(prepared_statement,param_idx,(duckdb_value)&VStack_58);
  }
  duckdb::Value::~Value(&VStack_58);
  return dVar1;
}

Assistant:

duckdb_state duckdb_bind_decimal(duckdb_prepared_statement prepared_statement, idx_t param_idx, duckdb_decimal val) {
	auto hugeint_val = duckdb_internal_hugeint(val.value);
	if (val.width > duckdb::Decimal::MAX_WIDTH_INT64) {
		auto value = Value::DECIMAL(hugeint_val, val.width, val.scale);
		return duckdb_bind_value(prepared_statement, param_idx, (duckdb_value)&value);
	}
	auto value = hugeint_val.lower;
	auto duck_val = Value::DECIMAL((int64_t)value, val.width, val.scale);
	return duckdb_bind_value(prepared_statement, param_idx, (duckdb_value)&duck_val);
}